

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O0

Vec_Wec_t * Abc_NtkDetectFinClasses(Abc_Ntk_t *pNtk,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Abc_Obj_t *pAVar7;
  char *pcVar8;
  Vec_Int_t *pVVar9;
  Vec_Int_t *vNodes;
  Abc_Ntk_t *vResult_00;
  Vec_Int_t *vClass_00;
  Vec_Int_t *vCos;
  Vec_Int_t *vList_00;
  Vec_Int_t *pVVar10;
  undefined4 uVar11;
  Vec_Wec_t *pVVar12;
  undefined4 uVar13;
  int nCalls;
  int iObj;
  int i;
  Vec_Wec_t *vResult;
  Vec_Int_t *vList;
  Vec_Int_t *vNodeSet;
  Vec_Int_t *vCiSet;
  Vec_Int_t *vCoSet;
  Vec_Int_t *vClass;
  Vec_Wec_t *vCoSets;
  Vec_Wec_t *vClasses;
  Vec_Wec_t *vMap2;
  Vec_Wec_t *vMap;
  Vec_Int_t *vObjs;
  Vec_Int_t *vPairs;
  Vec_Int_t *vTypes;
  Abc_Ntk_t *pAStack_18;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  
  vPairs = (Vec_Int_t *)0x0;
  vTypes._4_4_ = fVerbose;
  pAStack_18 = pNtk;
  if (pNtk->vFins == (Vec_Int_t *)0x0) {
    printf("Current network does not have the required info.\n");
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    iVar1 = Abc_NtkIsSopLogic(pNtk);
    if ((iVar1 == 0) && (iVar1 = Abc_NtkIsMappedLogic(pAStack_18), iVar1 == 0)) {
      __assert_fail("Abc_NtkIsSopLogic(pNtk) || Abc_NtkIsMappedLogic(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                    ,0x47d,"Vec_Wec_t *Abc_NtkDetectFinClasses(Abc_Ntk_t *, int)");
    }
    iVar1 = Abc_NtkIsSopLogic(pAStack_18);
    if (iVar1 == 0) {
      iVar1 = Abc_NtkIsMappedLogic(pAStack_18);
      if (iVar1 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                      ,0x491,"Vec_Wec_t *Abc_NtkDetectFinClasses(Abc_Ntk_t *, int)");
      }
      iVar1 = Abc_NtkFinCheckTypesOk2(pAStack_18);
      if (iVar1 != 0) {
        pAVar7 = Abc_NtkObj(pAStack_18,iVar1);
        pcVar8 = Abc_ObjName(pAVar7);
        printf("Current network has mismatch between mapped gate size and fault gate size (for example, see node \"%s\").\n"
               ,pcVar8);
        return (Vec_Wec_t *)0x0;
      }
    }
    else {
      iVar1 = Abc_NtkFinCheckTypesOk(pAStack_18);
      if (iVar1 != 0) {
        pAVar7 = Abc_NtkObj(pAStack_18,iVar1);
        pcVar8 = Abc_ObjName(pAVar7);
        printf("Current network contains unsupported gate types (for example, see node \"%s\").\n",
               pcVar8);
        return (Vec_Wec_t *)0x0;
      }
      vPairs = Abc_NtkFinComputeTypes(pAStack_18);
    }
    pVVar9 = pAStack_18->vFins;
    vObjs = pVVar9;
    iVar1 = Abc_NtkObjNumMax(pAStack_18);
    vMap = (Vec_Wec_t *)Abc_NtkFinComputeObjects(pVVar9,&vMap2,iVar1);
    vCoSets = Abc_NtkDetectObjClasses(pAStack_18,(Vec_Int_t *)vMap,(Vec_Wec_t **)&vClass);
    pVVar9 = Vec_IntAlloc(1000);
    vNodes = Vec_IntAlloc(1000);
    iVar1 = Abc_NtkObjNumMax(pAStack_18);
    vClasses = Vec_WecStart(iVar1);
    vResult_00 = (Abc_Ntk_t *)Vec_WecAlloc(1000);
    for (nCalls = 0; iVar1 = Vec_WecSize(vCoSets), nCalls < iVar1; nCalls = nCalls + 1) {
      vClass_00 = Vec_WecEntry(vCoSets,nCalls);
      vCos = Vec_WecEntry((Vec_Wec_t *)vClass,nCalls);
      Abc_NtkFinMiterCollect(pAStack_18,vCos,pVVar9,vNodes);
      vList_00 = Abc_NtkFinCreateList(vMap2,vClass_00);
      pVVar10 = vList_00;
      pVVar12 = vClasses;
      iVar1 = Abc_NtkFinRefinement
                        (pAStack_18,vPairs,vCos,pVVar9,vNodes,vObjs,vList_00,vClasses,
                         (Vec_Wec_t *)vResult_00);
      uVar13 = (undefined4)((ulong)pVVar12 >> 0x20);
      uVar11 = (undefined4)((ulong)pVVar10 >> 0x20);
      if (vTypes._4_4_ != 0) {
        uVar2 = Vec_IntSize(vClass_00);
        uVar3 = Vec_IntSize(vList_00);
        uVar4 = Vec_IntSize(pVVar9);
        uVar5 = Vec_IntSize(vCos);
        iVar6 = Vec_IntSize(vNodes);
        printf("Group %4d :  Obj =%4d. Fins =%4d.  CI =%5d. CO =%5d. Node =%6d.  SAT calls =%5d.\n",
               (ulong)(uint)nCalls,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,
               CONCAT44(uVar11,iVar6),CONCAT44(uVar13,iVar1));
      }
      Vec_IntFree(vList_00);
    }
    for (nCalls = 0; iVar1 = Vec_WecSize((Vec_Wec_t *)vResult_00), nCalls < iVar1;
        nCalls = nCalls + 1) {
      pVVar10 = Vec_WecEntry((Vec_Wec_t *)vResult_00,nCalls);
      Vec_IntSort(pVVar10,0);
    }
    Vec_WecSortByFirstInt((Vec_Wec_t *)vResult_00,0);
    Vec_IntFreeP(&vPairs);
    Vec_IntFree((Vec_Int_t *)vMap);
    Vec_WecFree(vCoSets);
    Vec_WecFree(vMap2);
    Vec_WecFree(vClasses);
    Vec_WecFree((Vec_Wec_t *)vClass);
    Vec_IntFree(pVVar9);
    Vec_IntFree(vNodes);
    pNtk_local = vResult_00;
  }
  return (Vec_Wec_t *)pNtk_local;
}

Assistant:

Vec_Wec_t * Abc_NtkDetectFinClasses( Abc_Ntk_t * pNtk, int fVerbose )
{
    Vec_Int_t * vTypes = NULL; // gate types
    Vec_Int_t * vPairs;        // original info as a set of pairs (ObjId, TypeId)
    Vec_Int_t * vObjs;         // all those objects that have some fin 
    Vec_Wec_t * vMap;          // for each object, the set of fins
    Vec_Wec_t * vMap2;         // for each local object, the set of pairs (Info, Index)
    Vec_Wec_t * vClasses;      // classes of objects
    Vec_Wec_t * vCoSets;       // corresponding CO sets
    Vec_Int_t * vClass;        // one class
    Vec_Int_t * vCoSet;        // one set of COs
    Vec_Int_t * vCiSet;        // one set of CIs
    Vec_Int_t * vNodeSet;      // one set of nodes
    Vec_Int_t * vList;         // one info list
    Vec_Wec_t * vResult;       // resulting equivalences
    int i, iObj, nCalls;
    if ( pNtk->vFins == NULL )
    {
        printf( "Current network does not have the required info.\n" );
        return NULL;
    }
    assert( Abc_NtkIsSopLogic(pNtk) || Abc_NtkIsMappedLogic(pNtk) );
    if ( Abc_NtkIsSopLogic(pNtk) )
    {
        iObj = Abc_NtkFinCheckTypesOk(pNtk);
        if ( iObj )
        {
            printf( "Current network contains unsupported gate types (for example, see node \"%s\").\n", Abc_ObjName(Abc_NtkObj(pNtk, iObj)) );
            return NULL;
        }
        vTypes   = Abc_NtkFinComputeTypes( pNtk );
    }
    else if ( Abc_NtkIsMappedLogic(pNtk) )
    {
        iObj = Abc_NtkFinCheckTypesOk2(pNtk);
        if ( iObj )
        {
            printf( "Current network has mismatch between mapped gate size and fault gate size (for example, see node \"%s\").\n", Abc_ObjName(Abc_NtkObj(pNtk, iObj)) );
            return NULL;
        }
    }
    else assert( 0 );
    //Abc_NtkFrameExtend( pNtk );
    // collect data
    vPairs   = pNtk->vFins;
    vObjs    = Abc_NtkFinComputeObjects( vPairs, &vMap, Abc_NtkObjNumMax(pNtk) );
    vClasses = Abc_NtkDetectObjClasses( pNtk, vObjs, &vCoSets );
    // refine classes
    vCiSet   = Vec_IntAlloc( 1000 );
    vNodeSet = Vec_IntAlloc( 1000 );
    vMap2    = Vec_WecStart( Abc_NtkObjNumMax(pNtk) );
    vResult  = Vec_WecAlloc( 1000 );
    Vec_WecForEachLevel( vClasses, vClass, i )
    {
        // extract one window
        vCoSet = Vec_WecEntry( vCoSets, i );
        Abc_NtkFinMiterCollect( pNtk, vCoSet, vCiSet, vNodeSet );
        // refine one class
        vList = Abc_NtkFinCreateList( vMap, vClass );
        nCalls = Abc_NtkFinRefinement( pNtk, vTypes, vCoSet, vCiSet, vNodeSet, vPairs, vList, vMap2, vResult );
        if ( fVerbose )
            printf( "Group %4d :  Obj =%4d. Fins =%4d.  CI =%5d. CO =%5d. Node =%6d.  SAT calls =%5d.\n", 
                i, Vec_IntSize(vClass), Vec_IntSize(vList), Vec_IntSize(vCiSet), Vec_IntSize(vCoSet), Vec_IntSize(vNodeSet), nCalls );
        Vec_IntFree( vList );
    }
    // sort entries in each array
    Vec_WecForEachLevel( vResult, vClass, i )
        Vec_IntSort( vClass, 0 );
    // sort by the index of the first entry
    Vec_WecSortByFirstInt( vResult, 0 ); 
    // cleanup
    Vec_IntFreeP( & vTypes );
    Vec_IntFree( vObjs );
    Vec_WecFree( vClasses );
    Vec_WecFree( vMap );
    Vec_WecFree( vMap2 );
    Vec_WecFree( vCoSets );
    Vec_IntFree( vCiSet );
    Vec_IntFree( vNodeSet );
    return vResult;
}